

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O3

uint64_t aom_mse_wxh_16bit_avx2(uint8_t *dst,int dstride,uint16_t *src,int sstride,int w,int h)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar6 [64];
  
  if (w == 8) {
    auVar4 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar6 = ZEXT1664((undefined1  [16])0x0);
    auVar5 = auVar6._0_32_;
    if (0 < h) {
      uVar3 = 0;
      do {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(ulong *)((long)dst + (long)dstride);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)dst;
        auVar7 = vpunpcklqdq_avx(auVar9,auVar7);
        auVar5 = vpmovzxbw_avx2(auVar7);
        auVar11._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src + (long)sstride * 2) +
             ZEXT116(1) * *(undefined1 (*) [16])src;
        auVar11._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src + (long)sstride * 2);
        auVar5 = vpsubw_avx2(auVar11,auVar5);
        auVar5 = vpabsw_avx2(auVar5);
        auVar5 = vpmaddwd_avx2(auVar5,auVar5);
        auVar5 = vpaddd_avx2(auVar5,auVar6._0_32_);
        auVar6 = ZEXT3264(auVar5);
        uVar3 = uVar3 + 2;
        src = (uint16_t *)(*(undefined1 (*) [16])src + (long)sstride * 4);
        dst = (uint8_t *)((long)dst + (long)dstride * 2);
      } while (uVar3 < (uint)h);
    }
  }
  else {
    if (w != 4) {
      return 0xffffffffffffffff;
    }
    auVar4 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar6 = ZEXT1664((undefined1  [16])0x0);
    auVar5 = auVar6._0_32_;
    if (0 < h) {
      lVar1 = (long)sstride;
      lVar2 = (long)dstride;
      uVar3 = 0;
      do {
        auVar7 = vpinsrd_avx(ZEXT416(*(uint *)dst),*(undefined4 *)((long)dst + lVar2),1);
        auVar9 = vpinsrd_avx(ZEXT416(*(uint *)((long)dst + lVar2 * 2)),
                             *(undefined4 *)((long)dst + lVar2 * 3),1);
        auVar7 = vpunpcklqdq_avx(auVar7,auVar9);
        auVar5 = vpmovzxbw_avx2(auVar7);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)((long)src + lVar1 * 6);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *(ulong *)((long)src + lVar1 * 4);
        auVar7 = vpunpcklqdq_avx(auVar12,auVar8);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *(ulong *)((long)src + lVar1 * 2);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *(ulong *)src;
        auVar9 = vpunpcklqdq_avx(auVar14,auVar13);
        auVar10._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar9;
        auVar10._16_16_ = ZEXT116(1) * auVar7;
        auVar5 = vpsubw_avx2(auVar10,auVar5);
        auVar5 = vpabsw_avx2(auVar5);
        auVar5 = vpmaddwd_avx2(auVar5,auVar5);
        auVar5 = vpaddd_avx2(auVar5,auVar6._0_32_);
        auVar6 = ZEXT3264(auVar5);
        uVar3 = uVar3 + 4;
        src = (uint16_t *)((long)src + lVar1 * 8);
        dst = (uint8_t *)((long)dst + lVar2 * 4);
      } while (uVar3 < (uint)h);
    }
  }
  auVar11 = vpunpckldq_avx2(auVar5,auVar4);
  auVar5 = vpunpckhdq_avx2(auVar5,auVar4);
  auVar5 = vpaddq_avx2(auVar11,auVar5);
  auVar7 = vpaddq_avx(auVar5._0_16_,auVar5._16_16_);
  auVar9 = vpshufd_avx(auVar7,0xee);
  auVar7 = vpaddq_avx(auVar7,auVar9);
  return auVar7._0_8_;
}

Assistant:

uint64_t aom_mse_wxh_16bit_avx2(uint8_t *dst, int dstride, uint16_t *src,
                                int sstride, int w, int h) {
  assert((w == 8 || w == 4) && (h == 8 || h == 4) &&
         "w=8/4 and h=8/4 must be satisfied");
  switch (w) {
    case 4: return mse_4xh_16bit_avx2(dst, dstride, src, sstride, h);
    case 8: return mse_8xh_16bit_avx2(dst, dstride, src, sstride, h);
    default: assert(0 && "unsupported width"); return -1;
  }
}